

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::TextureDerivateCase::setupRenderState
          (TextureDerivateCase *this,deUint32 program)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  undefined4 uVar4;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  int texUnit;
  Functions *gl;
  deUint32 program_local;
  TextureDerivateCase *this_local;
  long lVar6;
  
  pRVar5 = Context::getRenderContext((this->super_TriangleDerivateCase).super_TestCase.m_context);
  iVar2 = (*pRVar5->_vptr_RenderContext[3])();
  lVar6 = CONCAT44(extraout_var,iVar2);
  (**(code **)(lVar6 + 8))(0x84c1);
  pcVar1 = *(code **)(lVar6 + 0xb8);
  dVar3 = glu::Texture2D::getGLTexture(this->m_texture);
  (*pcVar1)(0xde1,dVar3);
  (**(code **)(lVar6 + 0x1360))(0xde1,0x2801,0x2600);
  (**(code **)(lVar6 + 0x1360))(0xde1,0x2800,0x2600);
  (**(code **)(lVar6 + 0x1360))(0xde1,0x2802,0x812f);
  (**(code **)(lVar6 + 0x1360))(0xde1,0x2803,0x812f);
  pcVar1 = *(code **)(lVar6 + 0x14f0);
  uVar4 = (**(code **)(lVar6 + 0xb48))(program,"u_sampler");
  (*pcVar1)(uVar4,1);
  return;
}

Assistant:

void TextureDerivateCase::setupRenderState (deUint32 program)
{
	const glw::Functions&	gl			= m_context.getRenderContext().getFunctions();
	const int				texUnit		= 1;

	gl.activeTexture	(GL_TEXTURE0+texUnit);
	gl.bindTexture		(GL_TEXTURE_2D, m_texture->getGLTexture());
	gl.texParameteri	(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER,	GL_NEAREST);
	gl.texParameteri	(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER,	GL_NEAREST);
	gl.texParameteri	(GL_TEXTURE_2D, GL_TEXTURE_WRAP_S,		GL_CLAMP_TO_EDGE);
	gl.texParameteri	(GL_TEXTURE_2D, GL_TEXTURE_WRAP_T,		GL_CLAMP_TO_EDGE);

	gl.uniform1i		(gl.getUniformLocation(program, "u_sampler"), texUnit);
}